

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindCallableShader
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,char *pShaderGroupName,
          Uint32 CallableIndex,void *pData,Uint32 DataSize)

{
  Char *pCVar1;
  RenderDeviceVkImpl *this_00;
  GraphicsAdapterInfo *pGVar2;
  unsigned_long *puVar3;
  PipelineStateVkImpl *this_01;
  uchar *puVar4;
  value_type_conflict4 local_a1;
  unsigned_long local_a0;
  size_type local_98;
  long local_90;
  size_t Offset;
  undefined1 local_80 [4];
  Uint32 GroupSize;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  Uint32 DataSize_local;
  void *pData_local;
  Uint32 CallableIndex_local;
  char *pShaderGroupName_local;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = DataSize;
  if ((pData == (void *)0x0) != (DataSize == 0)) {
    FormatString<char[26],char[38]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",
               (char (*) [38])(ulong)(DataSize == 0));
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"BindCallableShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x152);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((pData != (void *)0x0) && (msg.field_2._12_4_ != this->m_ShaderRecordSize)) {
    FormatString<char[26],char[61]>
              ((string *)local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",
               (char (*) [61])this);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"BindCallableShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x153);
    std::__cxx11::string::~string((string *)local_80);
  }
  this_00 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                       );
  pGVar2 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  Offset._4_4_ = (pGVar2->RayTracing).ShaderGroupHandleSize;
  local_90 = (ulong)CallableIndex * (ulong)this->m_ShaderRecordStride;
  local_98 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&this->m_CallableShadersRecord);
  local_a0 = local_90 + (ulong)this->m_ShaderRecordStride;
  puVar3 = std::max<unsigned_long>(&local_98,&local_a0);
  local_a1 = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_CallableShadersRecord,*puVar3,&local_a1);
  this_01 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPSO);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_CallableShadersRecord);
  PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
            (&this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>,pShaderGroupName,
             puVar4 + local_90,(ulong)this->m_ShaderRecordStride);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_CallableShadersRecord);
  memcpy(puVar4 + (ulong)Offset._4_4_ + local_90,pData,(ulong)(uint)msg.field_2._12_4_);
  this->m_Changed = true;
  return;
}

Assistant:

BindCallableShader(const char* pShaderGroupName,
                                               Uint32      CallableIndex,
                                               const void* pData,
                                               Uint32      DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));

        const Uint32 GroupSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        const size_t Offset    = size_t{CallableIndex} * size_t{this->m_ShaderRecordStride};
        this->m_CallableShadersRecord.resize(std::max(this->m_CallableShadersRecord.size(), Offset + this->m_ShaderRecordStride), Uint8{EmptyElem});

        this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_CallableShadersRecord.data() + Offset, this->m_ShaderRecordStride);
        std::memcpy(this->m_CallableShadersRecord.data() + Offset + GroupSize, pData, DataSize);
        this->m_Changed = true;
    }